

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon.c
# Opt level: O0

int curr_mon_load(monst *mtmp)

{
  obj *local_20;
  obj *obj;
  int curload;
  monst *mtmp_local;
  
  obj._4_4_ = 0;
  for (local_20 = mtmp->minvent; local_20 != (obj *)0x0; local_20 = local_20->nobj) {
    if ((local_20->otyp != 0x214) || ((mtmp->data->mflags2 & 0x8000000) == 0)) {
      obj._4_4_ = local_20->owt + obj._4_4_;
    }
  }
  return obj._4_4_;
}

Assistant:

int curr_mon_load(struct monst *mtmp)
{
	int curload = 0;
	struct obj *obj;

	for (obj = mtmp->minvent; obj; obj = obj->nobj) {
		if (obj->otyp != BOULDER || !throws_rocks(mtmp->data))
			curload += obj->owt;
	}

	return curload;
}